

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O1

void __thiscall helics::FederateState::processDataMessage(FederateState *this,ActionMessage *cmd)

{
  long lVar1;
  long lVar2;
  TimeCoordinator *pTVar3;
  GlobalHandle *pGVar4;
  _Alloc_hider _Var5;
  size_type sVar6;
  bool bVar7;
  EndpointInfo *pEVar8;
  InputInfo *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 __s;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  string *psVar10;
  ActionMessage *command;
  ActionMessage *extraout_RDX_00;
  ActionMessage *extraout_RDX_01;
  ActionMessage *command_00;
  ActionMessage *extraout_RDX_03;
  ActionMessage *extraout_RDX_04;
  ActionMessage *extraout_RDX_05;
  ActionMessage *extraout_RDX_06;
  ActionMessage *extraout_RDX_07;
  ActionMessage *extraout_RDX_09;
  ActionMessage *pAVar11;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  GlobalHandle *pGVar12;
  Time valueTime;
  string_view fmt;
  string_view logMessageSource;
  string_view fmt_00;
  string_view logMessageSource_00;
  string_view query;
  string_view logMessageSource_01;
  string_view fmt_01;
  string_view logMessageSource_02;
  string_view fmt_02;
  string_view logMessageSource_03;
  string_view logMessageSource_04;
  string_view fmt_03;
  string_view logMessageSource_05;
  format_args args;
  string_view message;
  format_args args_00;
  string_view message_00;
  string_view message_01;
  format_args args_01;
  string_view message_02;
  format_args args_02;
  string_view message_03;
  string_view message_04;
  format_args args_03;
  string_view message_05;
  string qres;
  string local_e8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_c8;
  Message *local_c0;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_b8;
  size_t sStack_b0;
  anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 local_a8;
  double local_98;
  string local_88;
  pointer local_60;
  FederateState *local_58;
  SmallBuffer *local_50;
  GlobalHandle local_48;
  shared_ptr<const_helics::SmallBuffer> local_40;
  ActionMessage *extraout_RDX;
  ActionMessage *extraout_RDX_02;
  ActionMessage *extraout_RDX_08;
  
  if (cmd->messageAction == cmd_pub) {
    this_00 = InterfaceInfo::getInput
                        (&this->interfaceInformation,(InterfaceHandle)(cmd->dest_handle).hid);
    if (this_00 == (InputInfo *)0x0) {
      pEVar8 = InterfaceInfo::getEndpoint
                         (&this->interfaceInformation,(InterfaceHandle)(cmd->dest_handle).hid);
      if (pEVar8 != (EndpointInfo *)0x0) {
        TimeCoordinator::updateMessageTime
                  ((this->timeCoord)._M_t.
                   super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                   .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl,
                   (Time)(cmd->actionTime).internalTimeCode,(bool)(this->timeGranted_mode ^ 1));
        sVar6 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
        _Var5 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
        pAVar11 = command_00;
        if (0x11 < this->maxLogLevel) {
          prettyPrintString_abi_cxx11_(&local_e8,(helics *)cmd,command_00);
          local_88._M_dataplus._M_p = local_e8._M_dataplus._M_p;
          local_88._M_string_length = local_e8._M_string_length;
          fmt_01.size_ = 0xd;
          fmt_01.data_ = (char *)0x12;
          args_01.field_1.values_ = in_R9.values_;
          args_01.desc_ = (unsigned_long_long)&local_88;
          ::fmt::v11::vformat_abi_cxx11_
                    ((string *)&local_b8,(v11 *)"receive_message {}",fmt_01,args_01);
          logMessageSource_02._M_str = _Var5._M_p;
          logMessageSource_02._M_len = sVar6;
          message_02._M_str = (char *)local_b8.values_;
          message_02._M_len = sStack_b0;
          in_R9 = local_b8;
          logMessage(this,0x12,logMessageSource_02,message_02,false);
          pAVar11 = extraout_RDX_02;
          if (&(local_b8.values_)->field_0 != &local_a8) {
            operator_delete(local_b8.values_,(ulong)(local_a8.long_long_value + 1));
            pAVar11 = extraout_RDX_03;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
            pAVar11 = extraout_RDX_04;
          }
        }
        sVar6 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
        _Var5._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
        if (((cmd->actionTime).internalTimeCode < (this->time_granted).internalTimeCode) &&
           (this->timeMethod != ASYNC)) {
          prettyPrintString_abi_cxx11_(&local_88,(helics *)cmd,pAVar11);
          lVar1 = (cmd->actionTime).internalTimeCode;
          lVar2 = (this->time_granted).internalTimeCode;
          local_a8.double_value =
               (double)(lVar1 % 1000000000) * 1e-09 + (double)(lVar1 / 1000000000);
          local_98 = (double)(lVar2 % 1000000000) * 1e-09 + (double)(lVar2 / 1000000000);
          local_b8.values_ = (value<fmt::v11::context> *)local_88._M_dataplus._M_p;
          sStack_b0 = local_88._M_string_length;
          fmt_02.size_ = 0xaad;
          fmt_02.data_ = (char *)0x3d;
          args_02.field_1.values_ = in_R9.values_;
          args_02.desc_ = (unsigned_long_long)&local_b8;
          ::fmt::v11::vformat_abi_cxx11_
                    ((string *)&local_e8,
                     (v11 *)"received message {} at time({}) earlier than granted time({})",fmt_02,
                     args_02);
          logMessageSource_03._M_str = _Var5._M_p;
          logMessageSource_03._M_len = sVar6;
          message_03._M_str = local_e8._M_dataplus._M_p;
          message_03._M_len = local_e8._M_string_length;
          logMessage(this,3,logMessageSource_03,message_03,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
        }
        __s.values_ = (value<fmt::v11::context> *)operator_new(0x100);
        memset(__s.values_,0,0x100);
        *(undefined8 *)&__s.args_[2].field_0x18 = 0x40;
        __s.args_[3].value_.field_0.named_args.data = (named_arg_info<char> *)&(__s.args_)->type_;
        __s.args_[3].value_.field_0.string.size = 0;
        (((string *)(__s.values_ + 7))->_M_dataplus)._M_p = (pointer)(__s.values_ + 8);
        ((string *)(__s.values_ + 7))->_M_string_length = 0;
        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(__s.values_ + 8))->_M_local_buf[0] = '\0';
        (((string *)(__s.values_ + 9))->_M_dataplus)._M_p = (pointer)(__s.values_ + 10);
        ((string *)(__s.values_ + 9))->_M_string_length = 0;
        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(__s.values_ + 10))->_M_local_buf[0] = '\0';
        (((string *)(__s.values_ + 0xb))->_M_dataplus)._M_p = (pointer)(__s.values_ + 0xc);
        ((string *)(__s.values_ + 0xb))->_M_string_length = 0;
        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(__s.values_ + 0xc))->_M_local_buf[0] = '\0';
        (((string *)(__s.values_ + 0xd))->_M_dataplus)._M_p = (pointer)(__s.values_ + 0xe);
        ((string *)(__s.values_ + 0xd))->_M_string_length = 0;
        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(__s.values_ + 0xe))->_M_local_buf[0] = '\0';
        *(int32_t *)(__s.values_ + 0xf) = 0;
        *(void **)((long)(__s.values_ + 0xf) + 8) = (void *)0x0;
        local_b8.values_ = __s.values_;
        SmallBuffer::operator=((SmallBuffer *)&(__s.args_)->type_,&cmd->payload);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_b8.values_ + 7),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pEVar8->key)
        ;
        *(uint16_t *)((long)&(local_b8.values_)->field_0 + 8) = cmd->flags;
        ((local_b8.values_)->field_0).long_long_value = (cmd->actionTime).internalTimeCode;
        *(uint *)(local_b8.values_ + 0xf) = (uint)cmd->counter;
        *(int32_t *)((long)&(local_b8.values_)->field_0 + 0xc) = cmd->messageID;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (local_b8.values_ + 0xd),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pEVar8->key)
        ;
        local_c8.args_ = local_b8.args_;
        local_b8.values_ = (value<fmt::v11::context> *)0x0;
        EndpointInfo::addMessage
                  (pEVar8,(unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                          &local_c8);
        if ((Message *)local_c8.values_ != (Message *)0x0) {
          CLI::std::default_delete<helics::Message>::operator()
                    ((default_delete<helics::Message> *)&local_c8,(Message *)local_c8.values_);
        }
        local_c8.values_ = (value<fmt::v11::context> *)0x0;
        if ((this->state)._M_i < TERMINATING) {
          pTVar3 = (this->timeCoord)._M_t.
                   super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                   .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl;
          (**(code **)((long)(pTVar3->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator + 0x18))
                    (pTVar3,cmd);
        }
        if ((Message *)local_b8.values_ != (Message *)0x0) {
          CLI::std::default_delete<helics::Message>::operator()
                    ((default_delete<helics::Message> *)&local_b8,(Message *)local_b8.values_);
        }
      }
    }
    else {
      pGVar12 = (this_00->input_sources).
                super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pGVar4 = (this_00->input_sources).
               super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (pGVar12 != pGVar4) {
        do {
          if (((cmd->source_id).gid == (pGVar12->fed_id).gid) &&
             ((cmd->source_handle).hid == (pGVar12->handle).hid)) {
            lVar1 = (cmd->actionTime).internalTimeCode;
            valueTime.internalTimeCode = (this->time_granted).internalTimeCode;
            if (valueTime.internalTimeCode < lVar1) {
              valueTime.internalTimeCode = lVar1;
            }
            if (this->timeMethod != ASYNC) {
              valueTime.internalTimeCode = lVar1;
            }
            local_48 = *pGVar12;
            local_60 = (pointer)CONCAT44(local_60._4_4_,(uint)cmd->counter);
            local_50 = &cmd->payload;
            local_40.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)0x0;
            local_58 = this;
            p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
            p_Var9->_M_use_count = 1;
            p_Var9->_M_weak_count = 1;
            p_Var9->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_004dabd0;
            SmallBuffer::SmallBuffer((SmallBuffer *)(p_Var9 + 1),local_50);
            local_40.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (SmallBuffer *)(p_Var9 + 1);
            local_40.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var9;
            bVar7 = InputInfo::addData(this_00,local_48,valueTime,(uint)local_60,&local_40);
            pAVar11 = extraout_RDX_05;
            if (local_40.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_40.
                         super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
              pAVar11 = extraout_RDX_06;
            }
            this = local_58;
            if (bVar7) {
              if ((this_00->not_interruptible == false) &&
                 (TimeCoordinator::updateValueTime
                            ((local_58->timeCoord)._M_t.
                             super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                             .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl,
                             valueTime,(bool)(local_58->timeGranted_mode ^ 1)),
                 sVar6 = gHelicsEmptyStr_abi_cxx11_._M_string_length, pAVar11 = extraout_RDX_07,
                 0x17 < this->maxLogLevel)) {
                local_60 = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
                (**(code **)((long)(((this->timeCoord)._M_t.
                                     super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                                     .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>.
                                    _M_head_impl)->super_BaseTimeCoordinator).
                                   _vptr_BaseTimeCoordinator + 0x58))(&local_b8);
                logMessageSource_04._M_str = local_60;
                logMessageSource_04._M_len = sVar6;
                message_04._M_str = (char *)local_b8.values_;
                message_04._M_len = sStack_b0;
                in_R9 = local_b8;
                logMessage(this,0x18,logMessageSource_04,message_04,false);
                pAVar11 = extraout_RDX_08;
                if (&(local_b8.values_)->field_0 != &local_a8) {
                  operator_delete(local_b8.values_,(ulong)(local_a8.long_long_value + 1));
                  pAVar11 = extraout_RDX_09;
                }
              }
              sVar6 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
              _Var5._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
              if (0x11 < this->maxLogLevel) {
                prettyPrintString_abi_cxx11_(&local_88,(helics *)cmd,pAVar11);
                psVar10 = InputInfo::getSourceName_abi_cxx11_(this_00,*pGVar12);
                local_b8.values_ = (value<fmt::v11::context> *)local_88._M_dataplus._M_p;
                sStack_b0 = local_88._M_string_length;
                local_a8.long_long_value = (longlong)(psVar10->_M_dataplus)._M_p;
                local_a8.string.size = psVar10->_M_string_length;
                fmt_03.size_ = 0xdd;
                fmt_03.data_ = (char *)0x1e;
                args_03.field_1.args_ = in_R9.args_;
                args_03.desc_ = (unsigned_long_long)&local_b8;
                ::fmt::v11::vformat_abi_cxx11_
                          ((string *)&local_e8,(v11 *)"receive PUBLICATION {} from {}",fmt_03,
                           args_03);
                logMessageSource_05._M_str = _Var5._M_p;
                logMessageSource_05._M_len = sVar6;
                message_05._M_str = local_e8._M_dataplus._M_p;
                message_05._M_len = local_e8._M_string_length;
                logMessage(this,0x12,logMessageSource_05,message_05,false);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
                  operator_delete(local_e8._M_dataplus._M_p,
                                  local_e8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_88._M_dataplus._M_p != &local_88.field_2) {
                  operator_delete(local_88._M_dataplus._M_p,
                                  local_88.field_2._M_allocated_capacity + 1);
                }
              }
            }
            break;
          }
          pGVar12 = pGVar12 + 1;
        } while (pGVar12 != pGVar4);
      }
      if ((this->state)._M_i < TERMINATING) {
        pTVar3 = (this->timeCoord)._M_t.
                 super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                 .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl;
        (**(code **)((long)(pTVar3->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator + 0x18))
                  (pTVar3,cmd);
      }
    }
  }
  else if (((cmd->messageAction == cmd_send_message) &&
           (pEVar8 = InterfaceInfo::getEndpoint
                               (&this->interfaceInformation,(InterfaceHandle)(cmd->dest_handle).hid)
           , pEVar8 != (EndpointInfo *)0x0)) && (pEVar8->sourceOnly == false)) {
    lVar1 = (this->minimumReceiveTime).internalTimeCode;
    if ((cmd->actionTime).internalTimeCode < lVar1) {
      (cmd->actionTime).internalTimeCode = lVar1;
    }
    TimeCoordinator::updateMessageTime
              ((this->timeCoord)._M_t.
               super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
               .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl,
               (Time)(cmd->actionTime).internalTimeCode,(bool)(this->timeGranted_mode ^ 1));
    sVar6 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var5 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
    pAVar11 = command;
    if (0x11 < this->maxLogLevel) {
      prettyPrintString_abi_cxx11_(&local_e8,(helics *)cmd,command);
      local_88._M_dataplus._M_p = local_e8._M_dataplus._M_p;
      local_88._M_string_length = local_e8._M_string_length;
      fmt.size_ = 0xd;
      fmt.data_ = (char *)0x12;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)&local_88;
      ::fmt::v11::vformat_abi_cxx11_((string *)&local_b8,(v11 *)"receive_message {}",fmt,args);
      logMessageSource._M_str = _Var5._M_p;
      logMessageSource._M_len = sVar6;
      message._M_str = (char *)local_b8.values_;
      message._M_len = sStack_b0;
      in_R9 = local_b8;
      logMessage(this,0x12,logMessageSource,message,false);
      pAVar11 = extraout_RDX;
      if (&(local_b8.values_)->field_0 != &local_a8) {
        operator_delete(local_b8.values_,(ulong)(local_a8.long_long_value + 1));
        pAVar11 = extraout_RDX_00;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        pAVar11 = extraout_RDX_01;
      }
    }
    sVar6 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var5._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
    if (((cmd->actionTime).internalTimeCode < (this->time_granted).internalTimeCode) &&
       (this->timeMethod != ASYNC)) {
      prettyPrintString_abi_cxx11_(&local_88,(helics *)cmd,pAVar11);
      lVar1 = (cmd->actionTime).internalTimeCode;
      lVar2 = (this->time_granted).internalTimeCode;
      local_a8.double_value = (double)(lVar1 % 1000000000) * 1e-09 + (double)(lVar1 / 1000000000);
      local_98 = (double)(lVar2 % 1000000000) * 1e-09 + (double)(lVar2 / 1000000000);
      local_b8.values_ = (value<fmt::v11::context> *)local_88._M_dataplus._M_p;
      sStack_b0 = local_88._M_string_length;
      fmt_00.size_ = 0xaad;
      fmt_00.data_ = (char *)0x3d;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)&local_b8;
      ::fmt::v11::vformat_abi_cxx11_
                ((string *)&local_e8,
                 (v11 *)"received message {} at time({}) earlier than granted time({})",fmt_00,
                 args_00);
      logMessageSource_00._M_str = _Var5._M_p;
      logMessageSource_00._M_len = sVar6;
      message_00._M_str = local_e8._M_dataplus._M_p;
      message_00._M_len = local_e8._M_string_length;
      logMessage(this,3,logMessageSource_00,message_00,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      query._M_str = "global_time_debugging";
      query._M_len = 0x15;
      processQueryActual_abi_cxx11_((string *)&local_b8,this,query);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8,0,0,
                 "TIME DEBUGGING::",0x10);
      logMessageSource_01._M_str = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
      logMessageSource_01._M_len = gHelicsEmptyStr_abi_cxx11_._M_string_length;
      message_01._M_str = (char *)local_b8.values_;
      message_01._M_len = sStack_b0;
      logMessage(this,3,logMessageSource_01,message_01,false);
      if (&(local_b8.values_)->field_0 != &local_a8) {
        operator_delete(local_b8.values_,(ulong)(local_a8.long_long_value + 1));
      }
    }
    if ((this->state)._M_i < TERMINATING) {
      pTVar3 = (this->timeCoord)._M_t.
               super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
               .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl;
      (**(code **)((long)(pTVar3->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator + 0x18))
                (pTVar3,cmd);
    }
    createMessageFromCommand((helics *)&local_c0,cmd);
    EndpointInfo::addMessage
              (pEVar8,(unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                      &local_c0);
    if (local_c0 != (Message *)0x0) {
      CLI::std::default_delete<helics::Message>::operator()
                ((default_delete<helics::Message> *)&local_c0,local_c0);
    }
  }
  return;
}

Assistant:

void FederateState::processDataMessage(ActionMessage& cmd)
{
    switch (cmd.action()) {
        case CMD_SEND_MESSAGE: {
            auto* epi = interfaceInformation.getEndpoint(cmd.dest_handle);
            if (epi != nullptr && !epi->sourceOnly) {
                if (cmd.actionTime < minimumReceiveTime) {
                    cmd.actionTime = minimumReceiveTime;
                }
                // if (!epi->not_interruptible)
                {
                    timeCoord->updateMessageTime(cmd.actionTime, !timeGranted_mode);
                }
                LOG_DATA(fmt::format("receive_message {}", prettyPrintString(cmd)));
                if (cmd.actionTime < time_granted &&
                    timeMethod != TimeSynchronizationMethod::ASYNC) {
                    LOG_WARNING(
                        fmt::format("received message {} at time({}) earlier than granted time({})",
                                    prettyPrintString(cmd),
                                    static_cast<double>(cmd.actionTime),
                                    static_cast<double>(time_granted)));
                    auto qres = processQueryActual("global_time_debugging");
                    qres.insert(0, "TIME DEBUGGING::");
                    LOG_WARNING(qres);
                }

                if (state <= FederateStates::EXECUTING) {
                    timeCoord->processTimeMessage(cmd);
                }
                epi->addMessage(createMessageFromCommand(std::move(cmd)));
            }
        } break;
        case CMD_PUB: {
            auto* subI = interfaceInformation.getInput(InterfaceHandle(cmd.dest_handle));
            if (subI == nullptr) {
                auto* eptI = interfaceInformation.getEndpoint(cmd.dest_handle);
                if (eptI != nullptr) {
                    // if (!epi->not_interruptible)
                    {
                        timeCoord->updateMessageTime(cmd.actionTime, !timeGranted_mode);
                    }
                    LOG_DATA(fmt::format("receive_message {}", prettyPrintString(cmd)));
                    if (cmd.actionTime < time_granted &&
                        timeMethod != TimeSynchronizationMethod::ASYNC) {
                        LOG_WARNING(fmt::format(
                            "received message {} at time({}) earlier than granted time({})",
                            prettyPrintString(cmd),
                            static_cast<double>(cmd.actionTime),
                            static_cast<double>(time_granted)));
                    }
                    auto mess = std::make_unique<Message>();
                    mess->data = std::move(cmd.payload);
                    mess->dest = eptI->key;
                    mess->flags = cmd.flags;
                    mess->time = cmd.actionTime;
                    mess->counter = cmd.counter;
                    mess->messageID = cmd.messageID;
                    mess->original_dest = eptI->key;
                    eptI->addMessage(std::move(mess));
                    if (state <= FederateStates::EXECUTING) {
                        timeCoord->processTimeMessage(cmd);
                    }
                }
                break;
            }
            for (auto& src : subI->input_sources) {
                auto valueTime = cmd.actionTime;
                if (timeMethod == TimeSynchronizationMethod::ASYNC) {
                    if (valueTime < time_granted) {
                        valueTime = time_granted;
                    }
                }
                if ((cmd.source_id == src.fed_id) && (cmd.source_handle == src.handle)) {
                    if (subI->addData(src,
                                      valueTime,
                                      cmd.counter,
                                      std::make_shared<const SmallBuffer>(
                                          std::move(cmd.payload)))) {
                        if (!subI->not_interruptible) {
                            timeCoord->updateValueTime(valueTime, !timeGranted_mode);
                            LOG_TRACE(timeCoord->printTimeStatus());
                        }
                        LOG_DATA(fmt::format("receive PUBLICATION {} from {}",
                                             prettyPrintString(cmd),
                                             subI->getSourceName(src)));
                    }
                    // this can only match once
                    break;
                }
            }
            if (state <= FederateStates::EXECUTING) {
                timeCoord->processTimeMessage(cmd);
            }
        } break;
        default:
            break;
    }
}